

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

uint64_t round_to_uint_and_pack(FloatParts in,int rmode,int scale,uint64_t max,float_status *s)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint64_t uVar4;
  FloatParts FVar5;
  uint64_t local_68;
  ulong local_58;
  uint64_t r;
  FloatParts p;
  int orig_flags;
  float_status *s_local;
  uint64_t max_local;
  int scale_local;
  int rmode_local;
  FloatParts in_local;
  
  iVar2 = get_float_exception_flags(s);
  FVar5 = round_to_int(in,rmode,scale,s);
  p.frac._4_1_ = FVar5.cls;
  uVar3 = p.frac._4_1_ - 1;
  if (3 < uVar3 && p.frac._4_1_ != 5) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
               ,0x962,(char *)0x0);
  }
  bVar1 = (byte)iVar2;
  in_local._8_8_ = max;
  switch((long)&switchD_012bd360::switchdataD_013d02f8 +
         (long)(int)(&switchD_012bd360::switchdataD_013d02f8)[uVar3]) {
  case 0x12bd362:
    s->float_exception_flags = bVar1 | 1;
    break;
  case 0x12bd37e:
    s->float_exception_flags = bVar1 | 1;
    local_68 = max;
    if (((undefined1  [16])FVar5 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
      local_68 = 0;
    }
    in_local.exp = (undefined4)local_68;
    in_local.cls = local_68._4_1_;
    in_local.sign = (_Bool)local_68._5_1_;
    in_local._14_2_ = local_68._6_2_;
    break;
  case 0x12bd3b0:
    in_local.exp = 0;
    in_local.cls = float_class_unclassified;
    in_local.sign = false;
    in_local._14_2_ = 0;
    break;
  case 0x12bd3bd:
    if (((undefined1  [16])FVar5 & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
      p.frac._0_4_ = FVar5.exp;
      r = FVar5.frac;
      if ((int)p.frac < 0x3e) {
        local_58 = r >> (0x3eU - (char)FVar5.exp & 0x3f);
      }
      else {
        if (1 < (int)p.frac + -0x3e) {
          s->float_exception_flags = bVar1 | 1;
          return max;
        }
        local_58 = r << ((char)FVar5.exp - 0x3eU & 0x3f);
      }
      if (max < local_58) {
        s->float_exception_flags = bVar1 | 1;
      }
      else {
        in_local.exp = (undefined4)local_58;
        in_local.cls = local_58._4_1_;
        in_local.sign = (_Bool)local_58._5_1_;
        in_local._14_2_ = local_58._6_2_;
      }
    }
    else {
      s->float_exception_flags = bVar1 | 1;
      in_local.exp = 0;
      in_local.cls = float_class_unclassified;
      in_local.sign = false;
      in_local._14_2_ = 0;
    }
  }
  uVar4._0_4_ = in_local.exp;
  uVar4._4_1_ = in_local.cls;
  uVar4._5_1_ = in_local.sign;
  uVar4._6_2_ = in_local._14_2_;
  return uVar4;
}

Assistant:

static uint64_t round_to_uint_and_pack(FloatParts in, int rmode, int scale,
                                       uint64_t max, float_status *s)
{
    int orig_flags = get_float_exception_flags(s);
    FloatParts p = round_to_int(in, rmode, scale, s);
    uint64_t r;

    switch (p.cls) {
    case float_class_snan:
    case float_class_qnan:
        s->float_exception_flags = orig_flags | float_flag_invalid;
        return max;
    case float_class_inf:
        s->float_exception_flags = orig_flags | float_flag_invalid;
        return p.sign ? 0 : max;
    case float_class_zero:
        return 0;
    case float_class_normal:
        if (p.sign) {
            s->float_exception_flags = orig_flags | float_flag_invalid;
            return 0;
        }

        if (p.exp < DECOMPOSED_BINARY_POINT) {
            r = p.frac >> (DECOMPOSED_BINARY_POINT - p.exp);
        } else if (p.exp - DECOMPOSED_BINARY_POINT < 2) {
            r = p.frac << (p.exp - DECOMPOSED_BINARY_POINT);
        } else {
            s->float_exception_flags = orig_flags | float_flag_invalid;
            return max;
        }

        /* For uint64 this will never trip, but if p.exp is too large
         * to shift a decomposed fraction we shall have exited via the
         * 3rd leg above.
         */
        if (r > max) {
            s->float_exception_flags = orig_flags | float_flag_invalid;
            return max;
        }
        return r;
    default:
        g_assert_not_reached();
        return max;
    }
}